

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

ForeachLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForeachLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token keyword_00;
  ForeachLoopListSyntax *pFVar1;
  ForeachLoopListSyntax *loopList;
  ForeachLoopStatementSyntax *pFVar2;
  StatementSyntax *in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_RDI;
  Token TVar3;
  ForeachLoopListSyntax *vars;
  Token keyword;
  undefined1 in_stack_00000a86;
  undefined1 in_stack_00000a87;
  Parser *in_stack_00000a88;
  NamedLabelSyntax *label_00;
  ParserBase *in_stack_ffffffffffffff70;
  Info *local_30;
  
  TVar3 = ParserBase::consume(in_stack_ffffffffffffff70);
  pFVar1 = parseForeachLoopVariables((Parser *)keyword.info);
  label_00 = (NamedLabelSyntax *)(in_RDI + 4);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = (pointer)label_00;
  slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList(in_RDI,elements);
  local_30 = TVar3._0_8_;
  loopList = (ForeachLoopListSyntax *)
             parseStatement(in_stack_00000a88,(bool)in_stack_00000a87,(bool)in_stack_00000a86);
  keyword_00.info = local_30;
  keyword_00._0_8_ = pFVar1;
  pFVar2 = slang::syntax::SyntaxFactory::foreachLoopStatement
                     ((SyntaxFactory *)in_RSI._M_extent_value,label_00,in_RDI,keyword_00,loopList,
                      in_RDX);
  return pFVar2;
}

Assistant:

ForeachLoopStatementSyntax& Parser::parseForeachLoopStatement(NamedLabelSyntax* label,
                                                              AttrList attributes) {

    auto keyword = consume();
    auto& vars = parseForeachLoopVariables();
    return factory.foreachLoopStatement(label, attributes, keyword, vars, parseStatement(false));
}